

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

Vec_Int_t * Gia_RsbWindowInit(Gia_Man_t *p,Vec_Int_t *vPaths,int iPivot,int nIter)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  bool bVar9;
  int iVar10;
  int iNode;
  int iMeet;
  int local_38;
  uint local_34;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_00->pArray = piVar8;
  if ((iPivot < 0) || (p->nObjs <= iPivot)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar3 = p->pObjs;
  uVar6 = (uint)*(undefined8 *)(pGVar3 + (uint)iPivot);
  if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x31a,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  bVar5 = true;
  do {
    bVar9 = bVar5;
    uVar4 = *(undefined8 *)(pGVar3 + (uint)iPivot);
    uVar6 = (uint)((ulong)uVar4 >> 0x20);
    if (bVar9) {
      uVar6 = (uint)uVar4;
    }
    Gia_ManIncrementTravId(p);
    Vec_IntPush(p_00,iPivot - (uVar6 & 0x1fffffff));
    uVar6 = iPivot - (uVar6 & 0x1fffffff);
    if (((int)uVar6 < 0) || (vPaths->nSize <= (int)uVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vPaths->pArray[uVar6] = 0;
    if (p->nTravIdsAlloc <= (int)uVar6) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
    }
    p->pTravIds[uVar6] = p->nTravIds;
    iVar10 = 0;
    bVar5 = false;
  } while (bVar9);
  if (nIter < 1) {
LAB_007afb0f:
    if (iVar10 != nIter) {
      return p_00;
    }
  }
  else {
    iVar10 = 0;
    iVar7 = 0;
    do {
      iVar1 = p_00->nSize;
      iVar7 = Gia_RsbWindowExplore(p,p_00,iVar7,vPaths,(int *)&local_34,&local_38);
      if (iVar7 != 0) {
        iVar7 = p->nTravIdsAlloc;
        if (iVar7 <= (int)local_34) {
LAB_007afbe4:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        piVar8 = p->pTravIds;
        iVar1 = piVar8[(int)local_34];
        iVar2 = p->nTravIds;
        if (iVar1 == iVar2) {
          if (iVar7 <= local_38) {
            __assert_fail("Id < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x269,"int Gia_ObjIsTravIdPreviousId(Gia_Man_t *, int)");
          }
          if (piVar8[local_38] != iVar1 + -1) {
            __assert_fail("Gia_ObjIsTravIdPreviousId(p, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32c,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
        }
        else {
          if (iVar1 != iVar2 + -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32f,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
          if (iVar7 <= local_38) goto LAB_007afbe4;
          if (piVar8[local_38] != iVar2) {
            __assert_fail("Gia_ObjIsTravIdCurrentId(p, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32e,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
        }
        p_00->nSize = 0;
        if (((int)local_34 < 0) || (vPaths->nSize <= (int)local_34)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Gia_RsbWindowGather(p,vPaths,vPaths->pArray[local_34],p_00);
        Gia_RsbWindowGather(p,vPaths,local_38,p_00);
        Vec_IntPush(p_00,iPivot);
        goto LAB_007afb0f;
      }
      iVar10 = iVar10 + 1;
      iVar7 = iVar1;
    } while (nIter != iVar10);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Gia_RsbWindowInit( Gia_Man_t * p, Vec_Int_t * vPaths, int iPivot, int nIter )
{
    Vec_Int_t * vVisited = Vec_IntAlloc( 100 );
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot ); 
    int i, n, iStart = 0;
    assert( Gia_ObjIsAnd(pPivot) );
    // start paths for both fanins of the pivot node
    for ( n = 0; n < 2; n++ )
    {
        int iFan = Gia_ObjFaninId( pPivot, iPivot, n );
        Gia_ManIncrementTravId(p);
        Vec_IntPush( vVisited, iFan );
        Vec_IntWriteEntry( vPaths, iFan, 0 ); 
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    // perform several iterations of breadth-first search
    for ( i = 0; i < nIter; i++ )
    {
        int iMeet, iNode, iNext = Vec_IntSize(vVisited);
        if ( Gia_RsbWindowExplore( p, vVisited, iStart, vPaths, &iMeet, &iNode ) )
        {
            // found the shared path
            if ( Gia_ObjIsTravIdCurrentId(p, iMeet) )
                assert( Gia_ObjIsTravIdPreviousId(p, iNode) );
            else if ( Gia_ObjIsTravIdPreviousId(p, iMeet) )
                assert( Gia_ObjIsTravIdCurrentId(p, iNode) );
            else assert( 0 );
            // collect the initial window
            Vec_IntClear( vVisited );
            Gia_RsbWindowGather( p, vPaths, Vec_IntEntry(vPaths, iMeet), vVisited );
            Gia_RsbWindowGather( p, vPaths, iNode, vVisited );
            Vec_IntPush( vVisited, iPivot );
            break;
        }
        iStart = iNext;
    }
    // if no meeting point is found, make sure to return NULL
    if ( i == nIter )
        Vec_IntFreeP( &vVisited );
    return vVisited;
}